

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauTree.c
# Opt level: O3

void Dss_ManCacheAlloc(Dss_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Dss_Ent_t **ppDVar3;
  uint uVar4;
  int iVar5;
  
  if (p->nCache != 0) {
    __assert_fail("p->nCache == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                  ,0x37c,"void Dss_ManCacheAlloc(Dss_Man_t *)");
  }
  uVar4 = 99999;
  while( true ) {
    do {
      uVar1 = uVar4 + 1;
      uVar2 = uVar4 & 1;
      uVar4 = uVar1;
    } while (uVar2 != 0);
    if (uVar1 < 9) break;
    iVar5 = 5;
    while (uVar1 % (iVar5 - 2U) != 0) {
      uVar2 = iVar5 * iVar5;
      iVar5 = iVar5 + 2;
      if (uVar1 < uVar2) goto LAB_004ccd46;
    }
  }
LAB_004ccd46:
  p->nCache = uVar1;
  ppDVar3 = (Dss_Ent_t **)calloc((long)(int)uVar1,8);
  p->pCache = ppDVar3;
  return;
}

Assistant:

void Dss_ManCacheAlloc( Dss_Man_t * p )
{
    assert( p->nCache == 0 );
    p->nCache = Abc_PrimeCudd( 100000 );
    p->pCache = ABC_CALLOC( Dss_Ent_t *, p->nCache );
}